

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall deqp::gls::VertexArrayTest::compare(VertexArrayTest *this)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ContextArrayPack *pCVar7;
  ContextArrayPack *pCVar8;
  TestLog *log;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  long lVar15;
  RGBA thr;
  ulong uVar16;
  Surface *__n;
  Surface *pSVar17;
  ChannelOrder CVar18;
  void *pvVar19;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar20;
  int iVar21;
  int iVar22;
  ChannelOrder CVar23;
  int iVar24;
  int iVar25;
  _Alloc_hider _Var26;
  int iVar27;
  long lVar28;
  TextureFormat this_00;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  Surface error;
  string local_458;
  string local_438;
  int local_414;
  int local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  Surface local_3f8;
  Surface *local_3e0;
  string local_3d8;
  void *local_3b8;
  LogImageSet local_3b0;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  pCVar7 = this->m_rrArrayPack;
  pCVar8 = this->m_glArrayPack;
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (1 < *(int *)(CONCAT44(extraout_var,iVar11) + 0x20)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
               ,0x8a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
    pvVar19 = (void *)(pCVar7->m_screen).m_pixels.m_cap;
    if (pvVar19 != (void *)0x0) {
      pvVar19 = (pCVar7->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,
               (pCVar7->m_screen).m_width,(pCVar7->m_screen).m_height,1,pvVar19);
    local_240.m_name._M_dataplus._M_p = (pointer)0x300000008;
    pvVar19 = (void *)(pCVar8->m_screen).m_pixels.m_cap;
    if (pvVar19 != (void *)0x0) {
      pvVar19 = (pCVar8->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_2d0,(TextureFormat *)&local_240,
               (pCVar8->m_screen).m_width,(pCVar8->m_screen).m_height,1,pvVar19);
    bVar9 = tcu::fuzzyCompare(log,"Compare Results","Compare Results",
                              (ConstPixelBufferAccess *)local_1b0,
                              (ConstPixelBufferAccess *)&local_2d0,1.5,COMPARE_LOG_RESULT);
    this->m_isOk = bVar9;
    return;
  }
  local_3e0 = &pCVar8->m_screen;
  iVar11 = this->m_maxDiffGreen;
  iVar13 = this->m_maxDiffBlue;
  uVar4 = this->m_maxDiffRed;
  tcu::Surface::Surface(&local_3f8,(pCVar7->m_screen).m_width,(pCVar7->m_screen).m_height);
  this->m_isOk = true;
  iVar12 = (pCVar7->m_screen).m_height;
  if (iVar12 < 1) {
    this_00 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
LAB_00940b3a:
    paVar2 = &local_240.m_name.field_2;
    local_240.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Compare result","");
    paVar3 = &local_3b0.m_name.field_2;
    local_3b0.m_name._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"Result of rendering","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2d0,&local_240.m_name,&local_3b0.m_name);
    tcu::TestLog::startImageSet
              ((TestLog *)this_00,local_2d0.m_name._M_dataplus._M_p,
               local_2d0.m_description._M_dataplus._M_p);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Result","");
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Result","");
    pSVar17 = local_3e0;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_438,&local_458,local_3e0,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write((LogImage *)local_1b0,this_00.order,__buf_02,(size_t)pSVar17);
    tcu::TestLog::endImageSet((TestLog *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_3b0.m_name._M_dataplus._M_p,
                      local_3b0.m_name.field_2._M_allocated_capacity + 1);
    }
    _Var26._M_p = local_240.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p == paVar2) goto LAB_00940d37;
  }
  else {
    pSVar17 = &pCVar7->m_screen;
    thr.m_value = iVar11 << 8 | uVar4 | iVar13 << 0x10 | 0xff000000;
    uVar16 = (ulong)(uint)(pCVar7->m_screen).m_width;
    iVar11 = 0;
    do {
      if (0 < (int)uVar16) {
        iVar13 = iVar11 + -1;
        lVar15 = 0;
        do {
          iVar12 = (int)uVar16;
          iVar27 = (int)lVar15;
          uVar4 = *(uint *)((long)(pCVar8->m_screen).m_pixels.m_ptr +
                           (long)((pCVar8->m_screen).m_width * iVar11 + iVar27) * 4);
          if ((((iVar11 == 0) || (lVar15 == 0)) || (iVar11 + 1 == (pCVar7->m_screen).m_height)) ||
             (lVar15 + 1U == (uVar16 & 0xffffffff))) {
            *(uint *)((long)local_3f8.m_pixels.m_ptr +
                     (long)(local_3f8.m_width * iVar11 + iVar27) * 4) =
                 ((int)(((ulong)uVar4 & 0xffff) >> 1) + 0x7f80U & 0xff00) + (uVar4 & 0xff00ff) +
                 -0x1000000;
          }
          else {
            pvVar19 = (pCVar7->m_screen).m_pixels.m_ptr;
            uVar5 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar11 + iVar27) * 4);
            uVar6 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar11 + iVar27 + -1) * 4);
            iVar22 = (int)(lVar15 + 1U);
            if (uVar5 == uVar6) {
LAB_0093fe7e:
              uVar6 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar13 + iVar27) * 4);
              bVar9 = true;
              if (uVar5 != uVar6) {
                CVar18 = (uVar5 & 0xff) - (uVar6 & 0xff);
                CVar23 = -CVar18;
                if (0 < (int)CVar18) {
                  CVar23 = CVar18;
                }
                uVar29 = uVar5 >> 8 & 0xff;
                iVar21 = uVar29 - (uVar6 >> 8 & 0xff);
                iVar12 = -iVar21;
                if (0 < iVar21) {
                  iVar12 = iVar21;
                }
                uVar30 = uVar5 >> 0x10 & 0xff;
                iVar24 = uVar30 - (uVar6 >> 0x10 & 0xff);
                iVar21 = -iVar24;
                if (0 < iVar24) {
                  iVar21 = iVar24;
                }
                iVar25 = (uVar5 >> 0x18) - (uVar6 >> 0x18);
                iVar24 = -iVar25;
                if (0 < iVar25) {
                  iVar24 = iVar25;
                }
                local_1b0._0_4_ = iVar21 << 0x10 | iVar12 << 8 | iVar24 << 0x18 | CVar23;
                bVar10 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                if ((!bVar10) &&
                   (uVar6 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                                     (long)((pCVar7->m_screen).m_width * (iVar11 + 1) + iVar27) * 4)
                   , uVar5 != uVar6)) {
                  CVar18 = (uVar5 & 0xff) - (uVar6 & 0xff);
                  CVar23 = -CVar18;
                  if (0 < (int)CVar18) {
                    CVar23 = CVar18;
                  }
                  iVar21 = uVar29 - (uVar6 >> 8 & 0xff);
                  iVar12 = -iVar21;
                  if (0 < iVar21) {
                    iVar12 = iVar21;
                  }
                  iVar24 = uVar30 - (uVar6 >> 0x10 & 0xff);
                  iVar21 = -iVar24;
                  if (0 < iVar24) {
                    iVar21 = iVar24;
                  }
                  iVar25 = (uVar5 >> 0x18) - (uVar6 >> 0x18);
                  iVar24 = -iVar25;
                  if (0 < iVar25) {
                    iVar24 = iVar25;
                  }
                  local_1b0._0_4_ = iVar21 << 0x10 | iVar12 << 8 | iVar24 << 0x18 | CVar23;
                  bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                }
              }
            }
            else {
              CVar18 = (uVar5 & 0xff) - (uVar6 & 0xff);
              CVar23 = -CVar18;
              if (0 < (int)CVar18) {
                CVar23 = CVar18;
              }
              uVar29 = uVar5 >> 8 & 0xff;
              iVar21 = uVar29 - (uVar6 >> 8 & 0xff);
              iVar12 = -iVar21;
              if (0 < iVar21) {
                iVar12 = iVar21;
              }
              uVar30 = uVar5 >> 0x10 & 0xff;
              iVar24 = uVar30 - (uVar6 >> 0x10 & 0xff);
              iVar21 = -iVar24;
              if (0 < iVar24) {
                iVar21 = iVar24;
              }
              iVar25 = (uVar5 >> 0x18) - (uVar6 >> 0x18);
              iVar24 = -iVar25;
              if (0 < iVar25) {
                iVar24 = iVar25;
              }
              local_1b0._0_4_ = iVar21 << 0x10 | iVar12 << 8 | iVar24 << 0x18 | CVar23;
              bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              iVar12 = (pCVar7->m_screen).m_width;
              pvVar19 = (pCVar7->m_screen).m_pixels.m_ptr;
              if ((bVar9) ||
                 (uVar6 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar11 + iVar22) * 4),
                 uVar5 == uVar6)) goto LAB_0093fe7e;
              CVar18 = (uVar5 & 0xff) - (uVar6 & 0xff);
              CVar23 = -CVar18;
              if (0 < (int)CVar18) {
                CVar23 = CVar18;
              }
              iVar21 = uVar29 - (uVar6 >> 8 & 0xff);
              iVar12 = -iVar21;
              if (0 < iVar21) {
                iVar12 = iVar21;
              }
              iVar24 = uVar30 - (uVar6 >> 0x10 & 0xff);
              iVar21 = -iVar24;
              if (0 < iVar24) {
                iVar21 = iVar24;
              }
              iVar25 = (uVar5 >> 0x18) - (uVar6 >> 0x18);
              iVar24 = -iVar25;
              if (0 < iVar25) {
                iVar24 = iVar25;
              }
              local_1b0._0_4_ = iVar21 << 0x10 | iVar12 << 8 | iVar24 << 0x18 | CVar23;
              bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              if (bVar9) {
                iVar12 = (pCVar7->m_screen).m_width;
                pvVar19 = (pCVar7->m_screen).m_pixels.m_ptr;
                goto LAB_0093fe7e;
              }
              bVar9 = false;
            }
            iVar12 = (pCVar8->m_screen).m_width;
            pvVar19 = (pCVar8->m_screen).m_pixels.m_ptr;
            uVar6 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar11 + iVar27 + -1) * 4);
            uVar29 = uVar4 >> 0x18;
            if (uVar4 == uVar6) {
LAB_009401fb:
              uVar6 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar13 + iVar27) * 4);
              if (uVar4 != uVar6) {
                CVar18 = (uVar4 & 0xff) - (uVar6 & 0xff);
                CVar23 = -CVar18;
                if (0 < (int)CVar18) {
                  CVar23 = CVar18;
                }
                uVar30 = uVar4 >> 8 & 0xff;
                iVar22 = uVar30 - (uVar6 >> 8 & 0xff);
                iVar12 = -iVar22;
                if (0 < iVar22) {
                  iVar12 = iVar22;
                }
                uVar31 = uVar4 >> 0x10 & 0xff;
                iVar21 = uVar31 - (uVar6 >> 0x10 & 0xff);
                iVar22 = -iVar21;
                if (0 < iVar21) {
                  iVar22 = iVar21;
                }
                iVar24 = uVar29 - (uVar6 >> 0x18);
                iVar21 = -iVar24;
                if (0 < iVar24) {
                  iVar21 = iVar24;
                }
                local_1b0._0_4_ = iVar22 << 0x10 | iVar12 << 8 | iVar21 << 0x18 | CVar23;
                bVar10 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                if ((!bVar10) &&
                   (uVar6 = *(uint *)((long)(pCVar8->m_screen).m_pixels.m_ptr +
                                     (long)((pCVar8->m_screen).m_width * (iVar11 + 1) + iVar27) * 4)
                   , uVar4 != uVar6)) {
                  CVar18 = (uVar4 & 0xff) - (uVar6 & 0xff);
                  CVar23 = -CVar18;
                  if (0 < (int)CVar18) {
                    CVar23 = CVar18;
                  }
                  iVar22 = uVar30 - (uVar6 >> 8 & 0xff);
                  iVar12 = -iVar22;
                  if (0 < iVar22) {
                    iVar12 = iVar22;
                  }
                  iVar21 = uVar31 - (uVar6 >> 0x10 & 0xff);
                  iVar22 = -iVar21;
                  if (0 < iVar21) {
                    iVar22 = iVar21;
                  }
                  iVar24 = uVar29 - (uVar6 >> 0x18);
                  iVar21 = -iVar24;
                  if (0 < iVar24) {
                    iVar21 = iVar24;
                  }
                  local_1b0._0_4_ = iVar22 << 0x10 | iVar12 << 8 | iVar21 << 0x18 | CVar23;
                  bVar10 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                  goto LAB_00940344;
                }
              }
LAB_00940352:
              local_400 = uVar5 & 0xff;
              local_404 = uVar5 >> 8 & 0xff;
              local_3fc = uVar5 >> 0x10 & 0xff;
              local_408 = uVar4 & 0xff;
              local_40c = uVar4 >> 8 & 0xff;
              bVar9 = false;
              iVar12 = iVar13;
              iVar22 = -1;
              do {
                local_410 = iVar22;
                local_414 = iVar12;
                if (!bVar9) {
                  local_3b8 = (pCVar7->m_screen).m_pixels.m_ptr;
                  lVar28 = -1;
                  do {
                    uVar5 = *(uint *)((long)(pCVar8->m_screen).m_pixels.m_ptr +
                                     (long)((pCVar8->m_screen).m_width * local_414 + iVar27 +
                                           (int)lVar28) * 4);
                    iVar22 = local_400 - (uVar5 & 0xff);
                    iVar12 = -iVar22;
                    if (0 < iVar22) {
                      iVar12 = iVar22;
                    }
                    iVar21 = local_404 - (uVar5 >> 8 & 0xff);
                    iVar22 = -iVar21;
                    if (0 < iVar21) {
                      iVar22 = iVar21;
                    }
                    iVar24 = local_3fc - (uVar5 >> 0x10 & 0xff);
                    iVar21 = -iVar24;
                    if (0 < iVar24) {
                      iVar21 = iVar24;
                    }
                    uVar5 = *(uint *)((long)local_3b8 +
                                     (long)((pCVar7->m_screen).m_width * local_414 + iVar27 +
                                           (int)lVar28) * 4);
                    iVar25 = (uVar5 & 0xff) - local_408;
                    iVar24 = -iVar25;
                    if (0 < iVar25) {
                      iVar24 = iVar25;
                    }
                    iVar14 = (uVar5 >> 8 & 0xff) - local_40c;
                    iVar25 = -iVar14;
                    if (0 < iVar14) {
                      iVar25 = iVar14;
                    }
                    iVar20 = (uVar5 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff);
                    iVar14 = -iVar20;
                    if (0 < iVar20) {
                      iVar14 = iVar20;
                    }
                    bVar10 = true;
                    if (this->m_maxDiffBlue < iVar21) {
                      bVar10 = bVar9;
                    }
                    if (this->m_maxDiffGreen < iVar22) {
                      bVar10 = bVar9;
                    }
                    if (this->m_maxDiffRed < iVar12) {
                      bVar10 = bVar9;
                    }
                    bVar9 = true;
                    if (this->m_maxDiffBlue < iVar14) {
                      bVar9 = bVar10;
                    }
                    if (this->m_maxDiffGreen < iVar25) {
                      bVar9 = bVar10;
                    }
                    if (this->m_maxDiffRed < iVar24) {
                      bVar9 = bVar10;
                    }
                  } while ((lVar28 < 1) && (lVar28 = lVar28 + 1, !bVar9));
                }
                if (0 < local_410) break;
                iVar12 = local_414 + 1;
                iVar22 = local_410 + 1;
              } while (!bVar9);
              if (!bVar9) {
                *(undefined4 *)
                 ((long)local_3f8.m_pixels.m_ptr + (long)(local_3f8.m_width * iVar11 + iVar27) * 4)
                     = 0xff0000ff;
                this->m_isOk = false;
                goto LAB_0093fd67;
              }
            }
            else {
              CVar18 = (uVar4 & 0xff) - (uVar6 & 0xff);
              CVar23 = -CVar18;
              if (0 < (int)CVar18) {
                CVar23 = CVar18;
              }
              uVar30 = uVar4 >> 8 & 0xff;
              iVar21 = uVar30 - (uVar6 >> 8 & 0xff);
              iVar12 = -iVar21;
              if (0 < iVar21) {
                iVar12 = iVar21;
              }
              uVar31 = uVar4 >> 0x10 & 0xff;
              iVar24 = uVar31 - (uVar6 >> 0x10 & 0xff);
              iVar21 = -iVar24;
              if (0 < iVar24) {
                iVar21 = iVar24;
              }
              iVar25 = uVar29 - (uVar6 >> 0x18);
              iVar24 = -iVar25;
              if (0 < iVar25) {
                iVar24 = iVar25;
              }
              local_1b0._0_4_ = iVar21 << 0x10 | iVar12 << 8 | iVar24 << 0x18 | CVar23;
              bVar10 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              iVar12 = (pCVar8->m_screen).m_width;
              pvVar19 = (pCVar8->m_screen).m_pixels.m_ptr;
              if ((bVar10) ||
                 (uVar6 = *(uint *)((long)pvVar19 + (long)(iVar12 * iVar11 + iVar22) * 4),
                 uVar4 == uVar6)) goto LAB_009401fb;
              CVar18 = (uVar4 & 0xff) - (uVar6 & 0xff);
              CVar23 = -CVar18;
              if (0 < (int)CVar18) {
                CVar23 = CVar18;
              }
              iVar22 = uVar30 - (uVar6 >> 8 & 0xff);
              iVar12 = -iVar22;
              if (0 < iVar22) {
                iVar12 = iVar22;
              }
              iVar21 = uVar31 - (uVar6 >> 0x10 & 0xff);
              iVar22 = -iVar21;
              if (0 < iVar21) {
                iVar22 = iVar21;
              }
              iVar24 = uVar29 - (uVar6 >> 0x18);
              iVar21 = -iVar24;
              if (0 < iVar24) {
                iVar21 = iVar24;
              }
              local_1b0._0_4_ = iVar22 << 0x10 | iVar12 << 8 | iVar21 << 0x18 | CVar23;
              bVar10 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              if (bVar10) {
                iVar12 = (pCVar8->m_screen).m_width;
                pvVar19 = (pCVar8->m_screen).m_pixels.m_ptr;
                goto LAB_009401fb;
              }
              bVar10 = false;
LAB_00940344:
              if (bVar9 != false || bVar10 != false) goto LAB_00940352;
            }
            uVar4 = *(uint *)((long)(pCVar8->m_screen).m_pixels.m_ptr +
                             (long)((pCVar8->m_screen).m_width * iVar11 + iVar27) * 4);
            *(uint *)((long)local_3f8.m_pixels.m_ptr +
                     (long)(local_3f8.m_width * iVar11 + iVar27) * 4) =
                 (uVar4 & 0xff00ff) + (((uVar4 & 0xffff) >> 1) + 0x7f80 & 0xff00) + -0x1000000;
          }
LAB_0093fd67:
          lVar15 = lVar15 + 1;
          uVar16 = (ulong)pSVar17->m_width;
        } while (lVar15 < (long)uVar16);
        iVar12 = (pCVar7->m_screen).m_height;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar12);
    this_00 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    if ((this->m_isOk & 1U) != 0) goto LAB_00940b3a;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Image comparison failed, threshold = (",0x26);
    std::ostream::operator<<(poVar1,this->m_maxDiffRed);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,this->m_maxDiffGreen);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,this->m_maxDiffBlue);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Compare result","");
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Result of rendering","");
    tcu::LogImageSet::LogImageSet(&local_3b0,&local_438,&local_458);
    tcu::TestLog::startImageSet
              ((TestLog *)this_00,local_3b0.m_name._M_dataplus._M_p,
               local_3b0.m_description._M_dataplus._M_p);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Result","");
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Result","");
    __n = local_3e0;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2f0,&local_3d8,local_3e0,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    CVar23 = this_00.order;
    tcu::LogImage::write((LogImage *)local_1b0,CVar23,__buf,(size_t)__n);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"Reference","");
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Reference","");
    tcu::LogImage::LogImage(&local_2d0,&local_310,&local_330,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_2d0,CVar23,__buf_00,(size_t)pSVar17);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"ErrorMask","");
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"Error mask","");
    pSVar17 = &local_3f8;
    tcu::LogImage::LogImage(&local_240,&local_350,&local_370,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_240,CVar23,__buf_01,(size_t)pSVar17);
    tcu::TestLog::endImageSet((TestLog *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_description._M_dataplus._M_p != &local_3b0.m_description.field_2) {
      operator_delete(local_3b0.m_description._M_dataplus._M_p,
                      local_3b0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
      operator_delete(local_3b0.m_name._M_dataplus._M_p,
                      local_3b0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    local_240.m_name.field_2._M_allocated_capacity = local_438.field_2._M_allocated_capacity;
    _Var26._M_p = local_438._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p == &local_438.field_2) goto LAB_00940d37;
  }
  operator_delete(_Var26._M_p,local_240.m_name.field_2._M_allocated_capacity + 1);
LAB_00940d37:
  tcu::Surface::~Surface(&local_3f8);
  return;
}

Assistant:

void VertexArrayTest::compare (void)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		m_isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 1.5f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		tcu::RGBA		threshold	(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 255);
		tcu::Surface	error		(ref.getWidth(), ref.getHeight());

		m_isOk = true;

		for (int y = 0; y < ref.getHeight(); y++)
		{
			for (int x = 0; x < ref.getWidth(); x++)
			{
				tcu::RGBA	refPixel		= ref.getPixel(x, y);
				tcu::RGBA	screenPixel		= screen.getPixel(x, y);
				bool		isOkPixel		= false;

				if (y == 0 || y + 1 == ref.getHeight() || x == 0 || x + 1 == ref.getWidth())
				{
					// Don't check borders since the pixel neighborhood is undefined
					error.setPixel(x, y, tcu::RGBA(screenPixel.getRed(), (screenPixel.getGreen() + 255) / 2, screenPixel.getBlue(), 255));
					continue;
				}

				// Don't do comparisons for this pixel if it belongs to a one-pixel-thin part (i.e. it doesn't have similar-color neighbors in both x and y directions) in both result and reference.
				// This fixes some false negatives.
				bool		refThin			= (!tcu::compareThreshold(refPixel, ref.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(refPixel, ref.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x  , y+1), threshold));
				bool		screenThin		= (!tcu::compareThreshold(screenPixel, screen.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(screenPixel, screen.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x  , y+1), threshold));

				if (refThin && screenThin)
					isOkPixel = true;
				else
				{
					for (int dy = -1; dy < 2 && !isOkPixel; dy++)
					{
						for (int dx = -1; dx < 2 && !isOkPixel; dx++)
						{
							// Check reference pixel against screen pixel
							{
								tcu::RGBA	screenCmpPixel	= screen.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refPixel.getRed()	- screenCmpPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refPixel.getGreen()	- screenCmpPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refPixel.getBlue()	- screenCmpPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}

							// Check screen pixels against reference pixel
							{
								tcu::RGBA	refCmpPixel		= ref.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refCmpPixel.getRed()		- screenPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refCmpPixel.getGreen()	- screenPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refCmpPixel.getBlue()	- screenPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}
						}
					}
				}

				if (isOkPixel)
					error.setPixel(x, y, tcu::RGBA(screen.getPixel(x, y).getRed(), (screen.getPixel(x, y).getGreen() + 255) / 2, screen.getPixel(x, y).getBlue(), 255));
				else
				{
					error.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					m_isOk = false;
				}
			}
		}

		tcu::TestLog& log = m_testCtx.getLog();
		if (!m_isOk)
		{
			log << TestLog::Message << "Image comparison failed, threshold = (" << m_maxDiffRed << ", " << m_maxDiffGreen << ", " << m_maxDiffBlue << ")" << TestLog::EndMessage;
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result",		"Result",		screen)
				<< TestLog::Image("Reference",	"Reference",	ref)
				<< TestLog::Image("ErrorMask",	"Error mask",	error)
				<< TestLog::EndImageSet;
		}
		else
		{
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result", "Result", screen)
				<< TestLog::EndImageSet;
		}
	}
}